

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void Rescale(CPpmd7 *p)

{
  undefined2 uVar1;
  UInt16 UVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  CPpmd7_Context *pCVar5;
  bool bVar6;
  char cVar7;
  ushort uVar8;
  uint uVar9;
  CPpmd7 *node;
  void *pvVar10;
  CPpmd7 *pCVar11;
  CPpmd7 *in_RDI;
  CPpmd_State tmp_2;
  uint n1;
  uint n0;
  uint numStats;
  CPpmd_State tmp_1;
  CPpmd_State *s1;
  CPpmd_State tmp;
  CPpmd_State *s;
  CPpmd_State *stats;
  uint escFreq;
  uint sumFreq;
  uint adder;
  uint i;
  undefined4 local_52;
  byte bStackY_3d;
  CPpmd7 *in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffd0;
  CPpmd7 *pCVar12;
  CPpmd7 *pCVar13;
  uint local_18;
  int local_c;
  
  node = (CPpmd7 *)(in_RDI->Base + in_RDI->MinContext->Stats);
  pCVar13 = (CPpmd7 *)in_RDI->FoundState;
  uVar3 = *(undefined4 *)&pCVar13->MinContext;
  uVar1 = *(undefined2 *)((long)&pCVar13->MinContext + 4);
  for (; pCVar13 != node; pCVar13 = (CPpmd7 *)(pCVar13[-1].BinSumm[0x7f] + 0x3d)) {
    *(undefined4 *)&pCVar13->MinContext = *(undefined4 *)(pCVar13[-1].BinSumm[0x7f] + 0x3d);
    *(UInt16 *)((long)&pCVar13->MinContext + 4) = pCVar13[-1].BinSumm[0x7f][0x3f];
  }
  *(undefined4 *)&pCVar13->MinContext = uVar3;
  *(undefined2 *)((long)&pCVar13->MinContext + 4) = uVar1;
  local_18 = (uint)in_RDI->MinContext->SummFreq - (uint)*(byte *)((long)&pCVar13->MinContext + 1);
  *(char *)((long)&pCVar13->MinContext + 1) = *(char *)((long)&pCVar13->MinContext + 1) + '\x04';
  uVar9 = (uint)(in_RDI->OrderFall != 0);
  *(char *)((long)&pCVar13->MinContext + 1) =
       (char)(*(byte *)((long)&pCVar13->MinContext + 1) + uVar9 >> 1);
  uVar8 = (ushort)*(byte *)((long)&pCVar13->MinContext + 1);
  local_c = in_RDI->MinContext->NumStats - 1;
  do {
    pCVar12 = pCVar13;
    pCVar13 = (CPpmd7 *)((long)&pCVar12->MinContext + 6);
    local_18 = local_18 - *(byte *)((long)&pCVar12->MinContext + 7);
    *(char *)((long)&pCVar12->MinContext + 7) =
         (char)(*(byte *)((long)&pCVar12->MinContext + 7) + uVar9 >> 1);
    uVar8 = *(byte *)((long)&pCVar12->MinContext + 7) + uVar8;
    if (*(byte *)((long)&pCVar12->MinContext + 1) < *(byte *)((long)&pCVar12->MinContext + 7)) {
      uVar4 = *(undefined4 *)&pCVar13->MinContext;
      UVar2 = *(UInt16 *)((long)&pCVar12->MaxContext + 2);
      in_stack_ffffffffffffffc8 = pCVar13;
      do {
        pCVar11 = in_stack_ffffffffffffffc8;
        *(undefined4 *)&pCVar11->MinContext = *(undefined4 *)(pCVar11[-1].BinSumm[0x7f] + 0x3d);
        *(UInt16 *)((long)&pCVar11->MinContext + 4) = pCVar11[-1].BinSumm[0x7f][0x3f];
        in_stack_ffffffffffffffc8 = (CPpmd7 *)(pCVar11[-1].BinSumm[0x7f] + 0x3d);
        bVar6 = false;
        if (in_stack_ffffffffffffffc8 != node) {
          bStackY_3d = (byte)((uint)uVar4 >> 8);
          bVar6 = *(byte *)((long)pCVar11[-1].BinSumm[0x7f] + 0x75) < bStackY_3d;
        }
      } while (bVar6);
      *(undefined4 *)&in_stack_ffffffffffffffc8->MinContext = uVar4;
      pCVar11[-1].BinSumm[0x7f][0x3f] = UVar2;
    }
    local_c = local_c + -1;
  } while (local_c != 0);
  if (*(char *)((long)&pCVar12->MinContext + 7) == '\0') {
    uVar9 = (uint)in_RDI->MinContext->NumStats;
    local_c = 0;
    do {
      local_c = local_c + 1;
      pCVar11 = (CPpmd7 *)(pCVar13[-1].BinSumm[0x7f] + 0x3d);
      pCVar12 = pCVar13 + -1;
      pCVar13 = pCVar11;
    } while (*(char *)((long)pCVar12->BinSumm[0x7f] + 0x7b) == '\0');
    local_18 = local_c + local_18;
    in_RDI->MinContext->NumStats = in_RDI->MinContext->NumStats - (short)local_c;
    if (in_RDI->MinContext->NumStats == 1) {
      local_52 = *(undefined4 *)&node->MinContext;
      uVar1 = *(undefined2 *)((long)&node->MinContext + 4);
      do {
        cVar7 = local_52._1_1_ - (char)((int)(uint)local_52._1_1_ >> 1);
        local_52._0_2_ = CONCAT11(cVar7,(undefined1)local_52);
        local_18 = local_18 >> 1;
      } while (1 < local_18);
      InsertNode(in_RDI,node,(uint)in_RDI->Units2Indx[(uVar9 + 1 >> 1) - 1]);
      pCVar5 = in_RDI->MinContext;
      in_RDI->FoundState = (CPpmd_State *)&pCVar5->SummFreq;
      *(undefined4 *)&pCVar5->SummFreq = local_52;
      *(undefined2 *)((long)&pCVar5->Stats + 2) = uVar1;
      return;
    }
    if (uVar9 + 1 >> 1 != (int)(in_RDI->MinContext->NumStats + 1) >> 1) {
      pvVar10 = ShrinkUnits(pCVar11,(void *)CONCAT26(uVar1,CONCAT42(uVar3,in_stack_ffffffffffffffd0)
                                                    ),
                            (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                            (uint)in_stack_ffffffffffffffc8);
      in_RDI->MinContext->Stats = (int)pvVar10 - (int)in_RDI->Base;
    }
  }
  in_RDI->MinContext->SummFreq = (uVar8 + (short)local_18) - (short)(local_18 >> 1);
  in_RDI->FoundState = (CPpmd_State *)(in_RDI->Base + in_RDI->MinContext->Stats);
  return;
}

Assistant:

static void Rescale(CPpmd7 *p)
{
  unsigned i, adder, sumFreq, escFreq;
  CPpmd_State *stats = STATS(p->MinContext);
  CPpmd_State *s = p->FoundState;
  {
    CPpmd_State tmp = *s;
    for (; s != stats; s--)
      s[0] = s[-1];
    *s = tmp;
  }
  escFreq = p->MinContext->SummFreq - s->Freq;
  s->Freq += 4;
  adder = (p->OrderFall != 0);
  s->Freq = (Byte)((s->Freq + adder) >> 1);
  sumFreq = s->Freq;
  
  i = p->MinContext->NumStats - 1;
  do
  {
    escFreq -= (++s)->Freq;
    s->Freq = (Byte)((s->Freq + adder) >> 1);
    sumFreq += s->Freq;
    if (s[0].Freq > s[-1].Freq)
    {
      CPpmd_State *s1 = s;
      CPpmd_State tmp = *s1;
      do
        s1[0] = s1[-1];
      while (--s1 != stats && tmp.Freq > s1[-1].Freq);
      *s1 = tmp;
    }
  }
  while (--i);
  
  if (s->Freq == 0)
  {
    unsigned numStats = p->MinContext->NumStats;
    unsigned n0, n1;
    do { i++; } while ((--s)->Freq == 0);
    escFreq += i;
    p->MinContext->NumStats = (UInt16)(p->MinContext->NumStats - i);
    if (p->MinContext->NumStats == 1)
    {
      CPpmd_State tmp = *stats;
      do
      {
        tmp.Freq = (Byte)(tmp.Freq - (tmp.Freq >> 1));
        escFreq >>= 1;
      }
      while (escFreq > 1);
      InsertNode(p, stats, U2I(((numStats + 1) >> 1)));
      *(p->FoundState = ONE_STATE(p->MinContext)) = tmp;
      return;
    }
    n0 = (numStats + 1) >> 1;
    n1 = (p->MinContext->NumStats + 1) >> 1;
    if (n0 != n1)
      p->MinContext->Stats = STATS_REF(ShrinkUnits(p, stats, n0, n1));
  }
  p->MinContext->SummFreq = (UInt16)(sumFreq + escFreq - (escFreq >> 1));
  p->FoundState = STATS(p->MinContext);
}